

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O0

uint32_t pbrt::ReverseBits32(uint32_t n)

{
  uint uVar1;
  uint32_t n_local;
  
  uVar1 = n << 0x10 | n >> 0x10;
  uVar1 = (uVar1 & 0xff00ff) << 8 | (uVar1 & 0xff00ff00) >> 8;
  uVar1 = (uVar1 & 0xf0f0f0f) << 4 | (uVar1 & 0xf0f0f0f0) >> 4;
  uVar1 = (uVar1 & 0x33333333) << 2 | (uVar1 & 0xcccccccc) >> 2;
  return (uVar1 & 0x55555555) << 1 | (uVar1 & 0xaaaaaaaa) >> 1;
}

Assistant:

PBRT_CPU_GPU
inline uint32_t ReverseBits32(uint32_t n) {
#ifdef PBRT_IS_GPU_CODE
    return __brev(n);
#else
    n = (n << 16) | (n >> 16);
    n = ((n & 0x00ff00ff) << 8) | ((n & 0xff00ff00) >> 8);
    n = ((n & 0x0f0f0f0f) << 4) | ((n & 0xf0f0f0f0) >> 4);
    n = ((n & 0x33333333) << 2) | ((n & 0xcccccccc) >> 2);
    n = ((n & 0x55555555) << 1) | ((n & 0xaaaaaaaa) >> 1);
    return n;
#endif
}